

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  long lVar1;
  ulong c;
  ctrl_t *pcVar2;
  long lVar3;
  bool bVar4;
  uint64_t uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  ctrl_t cVar11;
  ulong uVar12;
  FindInfo FVar13;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58.heap.control = (common->heap_or_soo_).heap.control;
    local_58.heap.slot_array =
         (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
    CommonFields::set_capacity(common,new_capacity);
    bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x18,0x20);
    if (local_48 != 0) {
      if (bVar4) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,std::allocator<int>>,int>,void>,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
                  ((HashSetResizeHelper *)&local_58.heap,common,
                   (allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_> *)
                   common);
      }
      else {
        if ((char)local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        lVar1 = *(long *)((long)&common->heap_or_soo_ + 8);
        sVar9 = 0;
        sVar8 = local_48;
        uVar10 = local_58.heap.slot_array;
        do {
          if ((char)local_3f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_58.heap.control[sVar9]) {
            uVar5 = hash_internal::MixingHashState::CombineContiguousImpl
                              (&hash_internal::MixingHashState::kSeed,*(long *)uVar10,
                               *(long *)(uVar10 + 8) - *(long *)uVar10);
            uVar12 = (*(long *)(uVar10 + 8) - *(long *)uVar10 >> 2 ^ uVar5) * -0x234dd359734ecb13;
            FVar13 = find_first_non_full<void>
                               (common,uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                       (uVar12 & 0xff0000000000) >> 0x18 |
                                       (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 |
                                       (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
                                       uVar12 << 0x38);
            uVar6 = FVar13.offset;
            c = common->capacity_;
            if (c <= uVar6) {
              __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x744,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
            pcVar2 = (common->heap_or_soo_).heap.control;
            pcVar2[uVar6] = cVar11;
            pcVar2[(ulong)((uint)c & 0xf) + (uVar6 - 0xf & c)] = cVar11;
            lVar7 = uVar6 * 0x20;
            common->capacity_ = 0xffffffffffffff9c;
            lVar3 = *(long *)(uVar10 + 8);
            *(long *)(lVar1 + lVar7) = *(long *)uVar10;
            ((long *)(lVar1 + lVar7))[1] = lVar3;
            *(long *)(lVar1 + 0x10 + lVar7) = *(long *)(uVar10 + 0x10);
            *(long *)uVar10 = 0;
            *(long *)(uVar10 + 8) = 0;
            *(long *)(uVar10 + 0x10) = 0;
            *(undefined4 *)(lVar1 + 0x18 + lVar7) = *(undefined4 *)(uVar10 + 0x18);
            CommonFields::set_capacity(common,c);
            sVar8 = local_48;
          }
          sVar9 = sVar9 + 1;
          uVar10 = uVar10 + 0x20;
        } while (sVar9 != sVar8);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x20);
    }
    return;
  }
  __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe92,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, int>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }